

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpanel_bmod.c
# Opt level: O2

void cpanel_bmod(int m,int w,int jcol,int nseg,singlecomplex *dense,singlecomplex *tempv,int *segrep
                ,int *repfnz,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  int ncol;
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  flops_t *pfVar11;
  int *piVar12;
  int *piVar13;
  int_t *piVar14;
  int_t *piVar15;
  void *pvVar16;
  int_t *piVar17;
  float fVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int *piVar26;
  int *piVar27;
  singlecomplex *psVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  float *pfVar34;
  singlecomplex *psVar35;
  int iVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  int iVar49;
  uint nrow;
  int ldm;
  float fVar50;
  float fVar57;
  singlecomplex sVar51;
  singlecomplex sVar52;
  singlecomplex sVar53;
  singlecomplex sVar54;
  singlecomplex sVar55;
  singlecomplex sVar56;
  float fVar58;
  float fVar61;
  singlecomplex sVar59;
  singlecomplex sVar60;
  float fVar62;
  singlecomplex sVar63;
  singlecomplex sVar64;
  float fVar65;
  singlecomplex sVar66;
  singlecomplex sVar67;
  singlecomplex sVar68;
  singlecomplex sVar69;
  singlecomplex *local_158;
  
  pfVar11 = stat->ops;
  piVar12 = Glu->xsup;
  piVar13 = Glu->supno;
  piVar14 = Glu->lsub;
  piVar15 = Glu->xlsub;
  pvVar16 = Glu->lusup;
  piVar17 = Glu->xlusup;
  iVar19 = sp_ienv(3);
  iVar20 = sp_ienv(7);
  iVar20 = sp_ienv((uint)(iVar19 <= iVar20) * 4 + 3);
  iVar21 = sp_ienv(4);
  iVar22 = sp_ienv(5);
  iVar23 = iVar21 + iVar20;
  iVar49 = w + jcol;
  lVar32 = (long)nseg;
  iVar39 = 0;
  iVar19 = 0;
  if (0 < nseg) {
    iVar19 = nseg;
  }
  for (; iVar39 != iVar19; iVar39 = iVar39 + 1) {
    lVar32 = lVar32 + -1;
    iVar6 = segrep[lVar32];
    iVar7 = piVar12[piVar13[iVar6]];
    iVar36 = iVar6 - iVar7;
    iVar42 = iVar36 + 1;
    iVar8 = piVar15[iVar7];
    ldm = piVar15[(long)iVar7 + 1] - iVar8;
    nrow = ldm - iVar42;
    iVar44 = iVar8 + iVar36 + 1;
    iVar29 = ldm + 1;
    lVar25 = (long)(iVar8 + iVar36);
    iVar24 = ldm * iVar36 + iVar36 + 1;
    if ((iVar42 < iVar22) || ((int)nrow <= iVar21)) {
      uVar47 = 0;
      if (0 < (int)nrow) {
        uVar47 = (ulong)nrow;
      }
      lVar33 = (long)iVar44;
      piVar26 = repfnz;
      psVar35 = dense;
      for (iVar44 = jcol; iVar44 < iVar49; iVar44 = iVar44 + 1) {
        iVar42 = piVar26[iVar6];
        if (iVar42 != -1) {
          uVar37 = (iVar6 - iVar42) + 1;
          iVar31 = piVar17[iVar7];
          pfVar11[0x13] = (float)(int)((iVar6 - iVar42) * uVar37 * 4) + pfVar11[0x13];
          pfVar11[0x14] = (float)(int)(nrow * 8 * uVar37) + pfVar11[0x14];
          uVar38 = iVar6 - iVar42;
          if (uVar38 == 0) {
            fVar57 = psVar35[piVar14[lVar25]].i;
            iVar42 = piVar15[(long)iVar7 + 1];
            fVar50 = psVar35[piVar14[lVar25]].r;
            pfVar34 = (float *)((long)pvVar16 + (long)(iVar31 + iVar24) * 8 + 4);
            for (lVar40 = lVar33; lVar40 < iVar42; lVar40 = lVar40 + 1) {
              sVar64.r = psVar35[piVar14[lVar40]].r - (pfVar34[-1] * fVar50 + *pfVar34 * -fVar57);
              sVar64.i = psVar35[piVar14[lVar40]].i - (pfVar34[-1] * fVar57 + *pfVar34 * fVar50);
              psVar35[piVar14[lVar40]] = sVar64;
              pfVar34 = pfVar34 + 2;
            }
          }
          else if ((int)uVar38 < 3) {
            iVar42 = piVar14[lVar25];
            iVar31 = iVar31 + iVar36 * iVar29;
            iVar9 = piVar14[lVar25 + -1];
            lVar40 = (long)(iVar31 - ldm);
            fVar58 = psVar35[iVar9].r;
            fVar61 = psVar35[iVar9].i;
            fVar50 = psVar35[iVar42].r;
            fVar57 = psVar35[iVar42].i;
            if (uVar37 == 2) {
              fVar2 = *(float *)((long)pvVar16 + lVar40 * 8);
              fVar3 = *(float *)((long)pvVar16 + lVar40 * 8 + 4);
              sVar53.r = fVar50 - (fVar2 * fVar58 + fVar3 * -fVar61);
              sVar53.i = fVar57 - (fVar2 * fVar61 + fVar3 * fVar58);
              psVar35[iVar42] = sVar53;
              iVar42 = piVar15[(long)iVar7 + 1];
              lVar48 = (long)iVar31 * 8;
              for (lVar45 = 0; lVar33 + lVar45 < (long)iVar42; lVar45 = lVar45 + 1) {
                fVar50 = *(float *)((long)pvVar16 + lVar45 * 8 + lVar48 + 8);
                fVar57 = *(float *)((long)pvVar16 + lVar45 * 8 + lVar48 + 0xc);
                fVar2 = *(float *)((long)pvVar16 + lVar45 * 8 + lVar40 * 8 + 8);
                fVar3 = *(float *)((long)pvVar16 + lVar45 * 8 + lVar40 * 8 + 0xc);
                sVar67.r = psVar35[piVar14[lVar33 + lVar45]].r -
                           (fVar2 * fVar58 + fVar3 * -fVar61 +
                           fVar50 * sVar53.r + fVar57 * -sVar53.i);
                sVar67.i = psVar35[piVar14[lVar33 + lVar45]].i -
                           (fVar2 * fVar61 + fVar3 * fVar58 + fVar50 * sVar53.i + fVar57 * sVar53.r)
                ;
                psVar35[piVar14[lVar33 + lVar45]] = sVar67;
              }
            }
            else {
              lVar48 = (long)((iVar31 - ldm) - ldm);
              fVar62 = psVar35[piVar14[lVar25 + -2]].i;
              fVar65 = -fVar62;
              fVar2 = *(float *)((long)pvVar16 + lVar48 * 8 + -8);
              fVar3 = *(float *)((long)pvVar16 + lVar48 * 8 + -4);
              fVar4 = *(float *)((long)pvVar16 + lVar48 * 8);
              fVar5 = *(float *)((long)pvVar16 + lVar48 * 8 + 4);
              fVar18 = psVar35[piVar14[lVar25 + -2]].r;
              sVar60.r = fVar58 - (fVar2 * fVar18 + fVar3 * fVar65);
              sVar60.i = fVar61 - (fVar2 * fVar62 + fVar3 * fVar18);
              fVar58 = *(float *)((long)pvVar16 + lVar40 * 8);
              fVar61 = *(float *)((long)pvVar16 + lVar40 * 8 + 4);
              sVar55.r = fVar50 - (fVar4 * fVar18 + fVar5 * fVar65 +
                                  fVar58 * sVar60.r + fVar61 * -sVar60.i);
              sVar55.i = fVar57 - (fVar4 * fVar62 + fVar5 * fVar18 +
                                  fVar58 * sVar60.i + fVar61 * sVar60.r);
              psVar35[iVar42] = sVar55;
              psVar35[iVar9] = sVar60;
              iVar42 = piVar15[(long)iVar7 + 1];
              lVar48 = (long)iVar31 * 8;
              lVar45 = lVar40 * 8 + (long)ldm * -8 + 0xc;
              for (lVar46 = 0; lVar33 + lVar46 < (long)iVar42; lVar46 = lVar46 + 1) {
                fVar50 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar48 + 8);
                fVar57 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar48 + 0xc);
                fVar58 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar40 * 8 + 8);
                fVar61 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar40 * 8 + 0xc);
                fVar2 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar45 + -4);
                fVar3 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar45);
                sVar69.r = psVar35[piVar14[lVar33 + lVar46]].r -
                           (fVar2 * fVar18 + fVar3 * fVar65 +
                           fVar58 * sVar60.r + fVar61 * -sVar60.i +
                           fVar50 * sVar55.r + fVar57 * -sVar55.i);
                sVar69.i = psVar35[piVar14[lVar33 + lVar46]].i -
                           (fVar2 * fVar62 + fVar3 * fVar18 +
                           fVar58 * sVar60.i + fVar61 * sVar60.r +
                           fVar50 * sVar55.i + fVar57 * sVar55.r);
                psVar35[piVar14[lVar33 + lVar46]] = sVar69;
              }
            }
          }
          else {
            piVar1 = piVar14 + (iVar8 + (iVar42 - iVar7));
            for (uVar41 = 0; uVar41 <= uVar38; uVar41 = uVar41 + 1) {
              tempv[uVar41] = psVar35[piVar1[uVar41]];
            }
            iVar31 = iVar31 + (iVar42 - iVar7) * iVar29;
            clsolve(ldm,uVar37,(singlecomplex *)((long)pvVar16 + (long)iVar31 * 8),tempv);
            psVar28 = tempv + uVar37;
            cmatvec(ldm,nrow,uVar37,
                    (singlecomplex *)((long)pvVar16 + (long)(int)(iVar31 + uVar37) * 8),tempv,
                    psVar28);
            piVar27 = piVar1;
            for (uVar41 = 0; uVar41 <= uVar38; uVar41 = uVar41 + 1) {
              psVar35[piVar1[uVar41]] = tempv[uVar41];
              tempv[uVar41].r = 0.0;
              tempv[uVar41].i = 0.0;
              piVar27 = piVar27 + 1;
            }
            for (uVar41 = 0; uVar47 != uVar41; uVar41 = uVar41 + 1) {
              sVar54.r = psVar35[*piVar27].r - psVar28[uVar41].r;
              sVar54.i = psVar35[*piVar27].i - psVar28[uVar41].i;
              psVar35[*piVar27] = sVar54;
              psVar28[uVar41].r = 0.0;
              psVar28[uVar41].i = 0.0;
              piVar27 = piVar27 + 1;
            }
          }
        }
        piVar26 = piVar26 + m;
        psVar35 = psVar35 + m;
      }
    }
    else {
      lVar33 = (long)iVar44;
      piVar26 = repfnz;
      psVar28 = tempv;
      psVar35 = dense;
      for (iVar31 = jcol; iVar31 < iVar49; iVar31 = iVar31 + 1) {
        iVar9 = piVar26[iVar6];
        if (iVar9 != -1) {
          ncol = (iVar6 - iVar9) + 1;
          iVar30 = piVar17[iVar7];
          pfVar11[0x13] = (float)((iVar6 - iVar9) * ncol * 4) + pfVar11[0x13];
          pfVar11[0x14] = (float)(int)(nrow * 8 * ncol) + pfVar11[0x14];
          uVar37 = iVar6 - iVar9;
          if (uVar37 == 0) {
            fVar57 = psVar35[piVar14[lVar25]].i;
            iVar9 = piVar15[(long)iVar7 + 1];
            fVar50 = psVar35[piVar14[lVar25]].r;
            pfVar34 = (float *)((long)pvVar16 + (long)(iVar30 + iVar24) * 8 + 4);
            for (lVar40 = lVar33; lVar40 < iVar9; lVar40 = lVar40 + 1) {
              sVar63.r = psVar35[piVar14[lVar40]].r - (pfVar34[-1] * fVar50 + *pfVar34 * -fVar57);
              sVar63.i = psVar35[piVar14[lVar40]].i - (pfVar34[-1] * fVar57 + *pfVar34 * fVar50);
              psVar35[piVar14[lVar40]] = sVar63;
              pfVar34 = pfVar34 + 2;
            }
          }
          else if ((int)uVar37 < 3) {
            iVar9 = piVar14[lVar25];
            iVar10 = piVar14[lVar25 + -1];
            iVar30 = iVar30 + iVar36 * iVar29;
            lVar40 = (long)(iVar30 - ldm);
            fVar58 = psVar35[iVar10].r;
            fVar61 = psVar35[iVar10].i;
            fVar50 = psVar35[iVar9].r;
            fVar57 = psVar35[iVar9].i;
            if (ncol == 2) {
              fVar2 = *(float *)((long)pvVar16 + lVar40 * 8);
              fVar3 = *(float *)((long)pvVar16 + lVar40 * 8 + 4);
              sVar51.r = fVar50 - (fVar2 * fVar58 + fVar3 * -fVar61);
              sVar51.i = fVar57 - (fVar2 * fVar61 + fVar3 * fVar58);
              psVar35[iVar9] = sVar51;
              iVar9 = piVar15[(long)iVar7 + 1];
              lVar48 = (long)iVar30 * 8;
              for (lVar45 = 0; lVar33 + lVar45 < (long)iVar9; lVar45 = lVar45 + 1) {
                fVar50 = *(float *)((long)pvVar16 + lVar45 * 8 + lVar48 + 8);
                fVar57 = *(float *)((long)pvVar16 + lVar45 * 8 + lVar48 + 0xc);
                fVar2 = *(float *)((long)pvVar16 + lVar45 * 8 + lVar40 * 8 + 8);
                fVar3 = *(float *)((long)pvVar16 + lVar45 * 8 + lVar40 * 8 + 0xc);
                sVar66.r = psVar35[piVar14[lVar33 + lVar45]].r -
                           (fVar2 * fVar58 + fVar3 * -fVar61 +
                           fVar50 * sVar51.r + fVar57 * -sVar51.i);
                sVar66.i = psVar35[piVar14[lVar33 + lVar45]].i -
                           (fVar2 * fVar61 + fVar3 * fVar58 + fVar50 * sVar51.i + fVar57 * sVar51.r)
                ;
                psVar35[piVar14[lVar33 + lVar45]] = sVar66;
              }
            }
            else {
              lVar48 = (long)((iVar30 - ldm) - ldm);
              fVar62 = psVar35[piVar14[lVar25 + -2]].i;
              fVar65 = -fVar62;
              fVar2 = *(float *)((long)pvVar16 + lVar48 * 8 + -8);
              fVar3 = *(float *)((long)pvVar16 + lVar48 * 8 + -4);
              fVar4 = *(float *)((long)pvVar16 + lVar48 * 8);
              fVar5 = *(float *)((long)pvVar16 + lVar48 * 8 + 4);
              fVar18 = psVar35[piVar14[lVar25 + -2]].r;
              sVar59.r = fVar58 - (fVar2 * fVar18 + fVar3 * fVar65);
              sVar59.i = fVar61 - (fVar2 * fVar62 + fVar3 * fVar18);
              fVar58 = *(float *)((long)pvVar16 + lVar40 * 8);
              fVar61 = *(float *)((long)pvVar16 + lVar40 * 8 + 4);
              sVar52.r = fVar50 - (fVar4 * fVar18 + fVar5 * fVar65 +
                                  fVar58 * sVar59.r + fVar61 * -sVar59.i);
              sVar52.i = fVar57 - (fVar4 * fVar62 + fVar5 * fVar18 +
                                  fVar58 * sVar59.i + fVar61 * sVar59.r);
              psVar35[iVar9] = sVar52;
              psVar35[iVar10] = sVar59;
              iVar9 = piVar15[(long)iVar7 + 1];
              lVar48 = (long)iVar30 * 8;
              lVar45 = lVar40 * 8 + (long)ldm * -8 + 0xc;
              for (lVar46 = 0; lVar33 + lVar46 < (long)iVar9; lVar46 = lVar46 + 1) {
                fVar50 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar48 + 8);
                fVar57 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar48 + 0xc);
                fVar58 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar40 * 8 + 8);
                fVar61 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar40 * 8 + 0xc);
                fVar2 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar45 + -4);
                fVar3 = *(float *)((long)pvVar16 + lVar46 * 8 + lVar45);
                sVar68.r = psVar35[piVar14[lVar33 + lVar46]].r -
                           (fVar2 * fVar18 + fVar3 * fVar65 +
                           fVar58 * sVar59.r + fVar61 * -sVar59.i +
                           fVar50 * sVar52.r + fVar57 * -sVar52.i);
                sVar68.i = psVar35[piVar14[lVar33 + lVar46]].i -
                           (fVar2 * fVar62 + fVar3 * fVar18 +
                           fVar58 * sVar59.i + fVar61 * sVar59.r +
                           fVar50 * sVar52.i + fVar57 * sVar52.r);
                psVar35[piVar14[lVar33 + lVar46]] = sVar68;
              }
            }
          }
          else {
            for (uVar47 = 0; uVar47 <= uVar37; uVar47 = uVar47 + 1) {
              psVar28[uVar47] = psVar35[piVar14[(long)(iVar8 + (iVar9 - iVar7)) + uVar47]];
            }
            clsolve(ldm,ncol,(singlecomplex *)
                             ((long)pvVar16 + (long)(iVar30 + (iVar9 - iVar7) * iVar29) * 8),psVar28
                   );
          }
        }
        piVar26 = piVar26 + m;
        psVar35 = psVar35 + m;
        psVar28 = psVar28 + iVar23;
      }
      uVar37 = 0;
      while( true ) {
        if ((int)nrow <= (int)uVar37) break;
        uVar43 = uVar37 + iVar21;
        uVar38 = uVar43;
        if ((int)nrow < (int)uVar43) {
          uVar38 = nrow;
        }
        iVar24 = uVar38 - uVar37;
        if (iVar21 < (int)(uVar38 - uVar37)) {
          iVar24 = iVar21;
        }
        iVar29 = piVar17[iVar7];
        piVar26 = repfnz;
        psVar35 = dense;
        psVar28 = tempv + iVar20;
        local_158 = tempv;
        for (iVar36 = jcol; iVar36 < iVar49; iVar36 = iVar36 + 1) {
          iVar31 = piVar26[iVar6];
          if ((iVar31 != -1) && (2 < iVar6 - iVar31)) {
            cmatvec(ldm,iVar24,(iVar6 - iVar31) + 1,
                    (singlecomplex *)
                    ((long)pvVar16 +
                    (long)(int)((iVar31 - iVar7) * ldm + uVar37 + iVar42 + iVar29) * 8),local_158,
                    local_158 + iVar20);
            for (lVar25 = 0; lVar25 < iVar24; lVar25 = lVar25 + 1) {
              sVar56.r = psVar35[piVar14[iVar44 + lVar25]].r - psVar28[lVar25].r;
              sVar56.i = psVar35[piVar14[iVar44 + lVar25]].i - psVar28[lVar25].i;
              psVar35[piVar14[iVar44 + lVar25]] = sVar56;
              psVar28[lVar25].r = 0.0;
              psVar28[lVar25].i = 0.0;
            }
          }
          piVar26 = piVar26 + m;
          psVar35 = psVar35 + m;
          local_158 = local_158 + iVar23;
          psVar28 = psVar28 + iVar23;
        }
        iVar44 = iVar44 + iVar21;
        uVar37 = uVar43;
      }
      psVar28 = tempv;
      psVar35 = dense;
      piVar26 = repfnz;
      for (iVar24 = jcol; iVar24 < iVar49; iVar24 = iVar24 + 1) {
        iVar44 = piVar26[iVar6];
        if ((iVar44 != -1) && (2 < iVar6 - iVar44)) {
          for (uVar47 = 0; uVar47 <= (uint)(iVar6 - iVar44); uVar47 = uVar47 + 1) {
            psVar35[piVar14[(long)(iVar44 + (iVar8 - iVar7)) + uVar47]] = psVar28[uVar47];
            psVar28[uVar47].r = 0.0;
            psVar28[uVar47].i = 0.0;
          }
        }
        piVar26 = piVar26 + m;
        psVar35 = psVar35 + m;
        psVar28 = psVar28 + iVar23;
      }
    }
  }
  return;
}

Assistant:

void
cpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    singlecomplex     *dense,     /* out, of size n by w */
	    singlecomplex     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    singlecomplex       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    singlecomplex       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    singlecomplex       *dense_col;  /* dense[] for a column in the panel */
    singlecomplex       *tempv1;             /* Used in 1-D update */
    singlecomplex       *TriTmp, *MatvecTmp; /* used in 2-D update */
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};
    singlecomplex      comp_temp, comp_temp1;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		        c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        c_sub(&ukj1, &ukj1, &comp_temp);

		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        c_add(&comp_temp, &comp_temp, &comp_temp1);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    clsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    CGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    cgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    cmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
		        c_sub(&dense_col[irow], &dense_col[irow], 
                              &MatvecTmp[i]);
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += 4 * segsze * (segsze - 1);
		ops[GEMV] += 8 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
	    	        cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		        c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
  		        cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		        c_sub(&ukj1, &ukj1, &comp_temp);

		        cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
        		cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		        c_add(&comp_temp, &comp_temp, &comp_temp1);
		        c_sub(&ukj, &ukj, &comp_temp);
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			    cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			    c_add(&comp_temp, &comp_temp, &comp_temp1);
			    c_sub(&dense_col[irow], &dense_col[irow], &comp_temp);
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    cgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    clsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    cmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
		        c_sub(&dense_col[irow], &dense_col[irow], &tempv1[i]);
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}